

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaNtk.c
# Opt level: O2

void Cba_NtkPrintDistribSortOne(Vec_Ptr_t *vTypes,Vec_Ptr_t *vOccurs,int Type)

{
  uint uVar1;
  word *pwVar2;
  word *pwVar3;
  word wVar4;
  Vec_Wrd_t *p;
  Vec_Wrd_t *p_00;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  
  p = (Vec_Wrd_t *)Vec_PtrEntry(vTypes,Type);
  p_00 = (Vec_Wrd_t *)Vec_PtrEntry(vOccurs,Type);
  pwVar2 = p->pArray;
  uVar1 = p->nSize;
  uVar5 = 1;
  if (1 < (int)uVar1) {
    uVar5 = uVar1;
  }
  pwVar3 = p_00->pArray;
  uVar7 = 1;
  for (uVar8 = 0; uVar8 != uVar5 - 1; uVar8 = uVar8 + 1) {
    uVar11 = uVar8 & 0xffffffff;
    uVar9 = uVar7;
    while( true ) {
      uVar10 = (uint)uVar11;
      if (uVar1 == uVar9) break;
      uVar6 = (uint)uVar9;
      if (pwVar3[(int)uVar10] <= pwVar3[uVar9]) {
        uVar6 = uVar10;
      }
      uVar9 = uVar9 + 1;
      uVar11 = (ulong)uVar6;
    }
    wVar4 = pwVar2[uVar8];
    pwVar2[uVar8] = pwVar2[(int)uVar10];
    pwVar2[(int)uVar10] = wVar4;
    wVar4 = pwVar3[uVar8];
    pwVar3[uVar8] = pwVar3[(int)uVar10];
    pwVar3[(int)uVar10] = wVar4;
    uVar7 = uVar7 + 1;
  }
  Vec_WrdReverseOrder(p);
  Vec_WrdReverseOrder(p_00);
  return;
}

Assistant:

void Cba_NtkPrintDistribSortOne( Vec_Ptr_t * vTypes, Vec_Ptr_t * vOccurs, int Type )
{
    Vec_Wrd_t * vType  = (Vec_Wrd_t *)Vec_PtrEntry( vTypes, Type );
    Vec_Wrd_t * vOccur = (Vec_Wrd_t *)Vec_PtrEntry( vOccurs, Type );
    Vec_WrdSelectSortCost2( Vec_WrdArray(vType), Vec_WrdSize(vType), Vec_WrdArray(vOccur) );
    Vec_WrdReverseOrder( vType );
    Vec_WrdReverseOrder( vOccur );
}